

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O2

void __thiscall
wasm::SuffixTreeTest_TestTandemRepeat_Test::SuffixTreeTest_TestTandemRepeat_Test
          (SuffixTreeTest_TestTandemRepeat_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_002bd3b8;
  return;
}

Assistant:

TEST(SuffixTreeTest, TestTandemRepeat) {
  std::vector<unsigned> RepeatedRepetitionData = {1, 2, 3, 1, 2, 3};
  SuffixTree ST(RepeatedRepetitionData);
  std::vector<SuffixTree::RepeatedSubstring> SubStrings;
  for (auto It = ST.begin(); It != ST.end(); It++)
    SubStrings.push_back(*It);
  EXPECT_EQ(SubStrings.size(), 0u);
}